

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx.c
# Opt level: O1

void sx__debug_message(char *sourcefile,uint32_t line,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char text [2048];
  __va_list_tag local_8e8;
  undefined1 local_8c8 [24];
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2048];
  
  local_8e8.reg_save_area = local_8c8;
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  local_8e8.overflow_arg_area = &args[0].overflow_arg_area;
  local_8e8.gp_offset = 0x18;
  local_8e8.fp_offset = 0x30;
  local_8b0 = in_RCX;
  local_8a8 = in_R8;
  local_8a0 = in_R9;
  sx_vsnprintf(local_818,0x800,fmt,&local_8e8);
  (*g_assert_handler)(local_818,sourcefile,line);
  return;
}

Assistant:

void sx__debug_message(const char* sourcefile, uint32_t line, const char* fmt, ...)
{
    char text[2048];

    va_list args;
    va_start(args, fmt);
    sx_vsnprintf(text, sizeof(text), fmt, args);
    va_end(args);

    g_assert_handler(text, sourcefile, line);
}